

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O1

void __thiscall QPagePreview::paintEvent(QPagePreview *this,QPaintEvent *param_1)

{
  undefined8 uVar1;
  ColorGroup CVar2;
  int iVar3;
  undefined8 uVar4;
  long *plVar5;
  ClipOperation CVar6;
  Representation RVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  int iVar12;
  int iVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  QByteArrayView QVar18;
  undefined1 auVar19 [16];
  QPainter p;
  QSize pageSize;
  double local_108;
  double dStack_100;
  QRect local_e8;
  undefined8 local_d8;
  QRect local_d0;
  int iStack_c0;
  int iStack_bc;
  double local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  QSize local_80;
  undefined8 local_78;
  Representation RStack_70;
  Representation RStack_6c;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.wd.m_i = -0x55555556;
  local_80.ht.m_i = -0x55555556;
  auVar19 = QPageLayout::fullRectPoints();
  local_80.wd.m_i = (auVar19._8_4_ - auVar19._0_4_) + 1;
  local_80.ht.m_i = (auVar19._12_4_ - auVar19._4_4_) + 1;
  uVar4 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x1c);
  uVar1 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x14);
  local_b8 = (double)CONCAT44(((int)((ulong)uVar4 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) + -9,
                              ((int)uVar4 - (int)uVar1) + -9);
  iVar8 = 1;
  uVar4 = QSize::scaled(&local_80,(AspectRatioMode)&local_b8);
  dVar15 = (double)(int)uVar4;
  dVar16 = (double)(int)((ulong)uVar4 >> 0x20);
  auVar19._0_8_ = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
  auVar19._8_8_ = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
  auVar17._8_8_ = dVar16;
  auVar17._0_8_ = dVar15;
  auVar19 = minpd(_DAT_00157120,auVar19);
  auVar19 = maxpd(auVar19,_DAT_00157130);
  iStack_90 = (int)auVar19._0_8_ + -1;
  iStack_8c = (int)auVar19._8_8_ + -1;
  uVar4 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x1c);
  uVar1 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x14);
  local_98 = ((int)uVar4 - (int)uVar1) / 2 - iStack_90 / 2;
  iStack_94 = ((int)((ulong)uVar4 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) / 2 - iStack_8c / 2;
  iStack_90 = iStack_90 + local_98;
  iStack_8c = iStack_8c + iStack_94;
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_b8 = -NAN;
  uStack_b0 = 0xffffffff;
  uStack_ac = 0xffffffff;
  auVar13._0_8_ = (double)local_80.wd.m_i;
  auVar13._8_8_ = (double)local_80.ht.m_i;
  auVar19 = divpd(auVar17,auVar13);
  QPageLayout::margins((Unit)&local_b8);
  local_108 = auVar19._0_8_;
  dStack_100 = auVar19._8_8_;
  dVar15 = (double)CONCAT44(uStack_ac,uStack_b0) * dStack_100;
  iVar12 = (int)((double)((ulong)(local_b8 * local_108) & 0x8000000000000000 | 0x3fe0000000000000) +
                local_b8 * local_108);
  iVar14 = (int)((double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15);
  local_108 = local_108 * (double)CONCAT44(uStack_a4,local_a8);
  dStack_100 = dStack_100 * (double)CONCAT44(uStack_9c,uStack_a0);
  local_d0.x2.m_i = iVar12 + local_98;
  local_d0.y2.m_i = iVar14 + iStack_94;
  iStack_c0 = ((int)((double)((ulong)local_108 & 0x8000000000000000 | 0x3fe0000000000000) +
                    local_108) + iVar12 ^ 0xffffffffU) + iVar12 + iStack_90;
  iStack_bc = ((int)((double)((ulong)dStack_100 & 0x8000000000000000 | 0x3fe0000000000000) +
                    dStack_100) + iVar14 ^ 0xffffffffU) + iVar14 + iStack_8c;
  local_d0.x1.m_i = -0x55555556;
  local_d0.y1.m_i = -0x55555556;
  QPainter::QPainter((QPainter *)&local_d0,(QPaintDevice *)&this->field_0x10);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  CVar2 = QWidget::palette();
  plVar5 = (long *)QPalette::brush(CVar2,Dark);
  local_48 = *(undefined8 *)(*plVar5 + 8);
  uStack_40 = *(undefined8 *)(*plVar5 + 0x10);
  do {
    QColor::setAlpha((int)&local_48);
    iVar12 = iStack_8c;
    iVar11 = local_98 + iVar8;
    iVar14 = iStack_94 + iVar8;
    RVar7.m_i = iStack_90 + iVar8;
    iVar10 = iVar8 + iStack_8c;
    QPainter::setPen((QColor *)&local_d0);
    local_78 = (QArrayData *)CONCAT44(iVar10,iVar11);
    _RStack_70 = CONCAT44(iVar10,RVar7.m_i);
    QPainter::drawLines((QLine *)&local_d0,(int)&local_78);
    local_78 = (QArrayData *)CONCAT44(iVar14,RVar7.m_i);
    RStack_6c.m_i = iVar12 + iVar8 + -1;
    RStack_70.m_i = RVar7.m_i;
    QPainter::drawLines((QLine *)&local_d0,(int)&local_78);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 6);
  CVar2 = QWidget::palette();
  QPalette::brush(CVar2,Dark);
  QPainter::fillRect(&local_d0,(QBrush *)&local_98);
  if ((local_d0.x2.m_i <= iStack_c0) && (local_d0.y2.m_i <= iStack_bc)) {
    CVar2 = QWidget::palette();
    plVar5 = (long *)QPalette::brush(CVar2,Dark);
    QBrush::QBrush((QBrush *)&local_e8,(QColor *)(*plVar5 + 8),SolidPattern);
    iVar8 = 3;
    QPen::QPen((QPen *)0x0,(QPen *)&local_78,&local_e8,3,0x10,0x40);
    QPainter::setPen((QPen *)&local_d0);
    QPen::~QPen((QPen *)&local_78);
    QBrush::~QBrush((QBrush *)&local_e8);
    CVar6 = (int)&local_d0 + 8;
    QPainter::drawRects(&local_d0,CVar6);
    local_d0.x2.m_i = local_d0.x2.m_i + 2;
    local_d0.y2.m_i = local_d0.y2.m_i + 2;
    iStack_c0 = iStack_c0 + -1;
    iStack_bc = iStack_bc + -1;
    QPainter::setClipRect(&local_d0,CVar6);
    local_58 = 0xaaaaaaaaaaaaaaaa;
    uStack_50 = 0xaaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_58);
    dVar15 = (double)QFont::pointSizeF();
    QFont::setPointSizeF(dVar15 * 0.25);
    QPainter::setFont((QFont *)&local_d0);
    CVar2 = QWidget::palette();
    QPalette::brush(CVar2,Dark);
    QPainter::setPen((QColor *)&local_d0);
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    local_e8.x1.m_i = -0x55555556;
    local_e8.y1.m_i = -0x55555556;
    local_e8.x2.m_i = -0x55555556;
    local_e8.y2.m_i = -0x55555556;
    QVar18.m_data = (storage_type *)0x21f;
    QVar18.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar18);
    local_e8._0_8_ = local_78;
    local_e8.x2.m_i = RStack_70.m_i;
    local_e8.y2.m_i = RStack_6c.m_i;
    local_d8 = local_68;
    do {
      QString::append((QString *)&local_e8);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    if (0 < this->m_pagePreviewColumns) {
      iVar14 = (int)((double)((iStack_90 - local_98) + 1) * 0.1);
      iVar10 = ((iStack_bc - local_d0.y2.m_i) + (1 - this->m_pagePreviewRows) * iVar14 + 1) /
               this->m_pagePreviewRows;
      iVar12 = ((iStack_c0 - local_d0.x2.m_i) + (1 - this->m_pagePreviewColumns) * iVar14 + 1) /
               this->m_pagePreviewColumns;
      iVar8 = 0;
      do {
        if (0 < this->m_pagePreviewRows) {
          iVar11 = 0;
          iVar9 = 0;
          do {
            iVar3 = local_d0.x2.m_i + iVar8 * (iVar12 + iVar14);
            local_78 = (QArrayData *)CONCAT44(local_d0.y2.m_i + iVar11,iVar3);
            RStack_6c.m_i = local_d0.y2.m_i + iVar11 + iVar10 + -1;
            RStack_70.m_i = iVar3 + iVar12 + -1;
            QPainter::drawText(&local_d0,(int)&local_78,(QString *)0x1080,&local_e8);
            iVar9 = iVar9 + 1;
            iVar11 = iVar11 + iVar14 + iVar10;
          } while (iVar9 < this->m_pagePreviewRows);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->m_pagePreviewColumns);
    }
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    QFont::~QFont((QFont *)&local_58);
  }
  QPainter::~QPainter((QPainter *)&local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *) override
    {
        QSize pageSize = m_pageLayout.fullRectPoints().size();
        QSizeF scaledSize = pageSize.scaled(width() - 10, height() - 10, Qt::KeepAspectRatio);
        QRect pageRect = QRect(QPoint(0,0), scaledSize.toSize());
        pageRect.moveCenter(rect().center());
        qreal width_factor = scaledSize.width() / pageSize.width();
        qreal height_factor = scaledSize.height() / pageSize.height();
        QMarginsF margins = m_pageLayout.margins(QPageLayout::Point);
        int left = qRound(margins.left() * width_factor);
        int top = qRound(margins.top() * height_factor);
        int right = qRound(margins.right() * width_factor);
        int bottom = qRound(margins.bottom() * height_factor);
        QRect marginRect(pageRect.x() + left, pageRect.y() + top,
                         pageRect.width() - (left + right + 1), pageRect.height() - (top + bottom + 1));

        QPainter p(this);
        QColor shadow(palette().mid().color());
        for (int i=1; i<6; ++i) {
            shadow.setAlpha(180-i*30);
            QRect offset(pageRect.adjusted(i, i, i, i));
            p.setPen(shadow);
            p.drawLine(offset.left(), offset.bottom(), offset.right(), offset.bottom());
            p.drawLine(offset.right(), offset.top(), offset.right(), offset.bottom()-1);
        }
        p.fillRect(pageRect, palette().light());

        if (marginRect.isValid()) {
            p.setPen(QPen(palette().color(QPalette::Dark), 0, Qt::DotLine));
            p.drawRect(marginRect);

            marginRect.adjust(2, 2, -1, -1);
            p.setClipRect(marginRect);
            QFont font;
            font.setPointSizeF(font.pointSizeF()*0.25);
            p.setFont(font);
            p.setPen(palette().color(QPalette::Dark));
            QString text("Lorem ipsum dolor sit amet, consectetuer adipiscing elit, sed diam nonummy nibh euismod tincidunt ut laoreet dolore magna aliquam erat volutpat. Ut wisi enim ad minim veniam, quis nostrud exerci tation ullamcorper suscipit lobortis nisl ut aliquip ex ea commodo consequat. Duis autem vel eum iriure dolor in hendrerit in vulputate velit esse molestie consequat, vel illum dolore eu feugiat nulla facilisis at vero eros et accumsan et iusto odio dignissim qui blandit praesent luptatum zzril delenit augue duis dolore te feugait nulla facilisi."_L1);
            for (int i=0; i<3; ++i)
                text += text;

            const int spacing = pageRect.width() * 0.1;
            const int textWidth = (marginRect.width() - (spacing * (m_pagePreviewColumns-1))) / m_pagePreviewColumns;
            const int textHeight = (marginRect.height() - (spacing * (m_pagePreviewRows-1))) / m_pagePreviewRows;

            for (int x = 0 ; x < m_pagePreviewColumns; ++x) {
                for (int y = 0 ; y < m_pagePreviewRows; ++y) {
                    QRect textRect(marginRect.left() + x * (textWidth + spacing),
                                   marginRect.top() + y * (textHeight + spacing),
                                   textWidth, textHeight);
                    p.drawText(textRect, Qt::TextWordWrap|Qt::AlignVCenter, text);
                }
            }
        }
    }